

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::
best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
::mutation(best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
           *this,local_context *ctx,bit_array *x)

{
  int iVar1;
  int index;
  double *args;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_double>
  __aurng;
  double dVar2;
  string_view fmt;
  string_view fmt_00;
  undefined4 uStack_58;
  int i;
  result_type local_50;
  result_type local_48;
  result_type local_40;
  result_type local_38;
  
  dVar2 = (ctx->value_p_dist)._M_param._M_mean;
  if ((((dVar2 != 0.0) || (NAN(dVar2))) ||
      (dVar2 = (ctx->value_p_dist)._M_param._M_stddev, dVar2 != 0.0)) || (NAN(dVar2))) {
    do {
      do {
        local_40 = std::normal_distribution<double>::operator()(&ctx->variable_p_dist,&ctx->rng);
      } while (local_40 <= 0.0);
    } while (1.0 <= local_40);
    do {
      do {
        local_38 = std::normal_distribution<double>::operator()(&ctx->value_p_dist,&ctx->rng);
      } while (local_38 < 0.0);
    } while (1.0 < local_38);
    args = &local_38;
    fmt._M_str = (char *)&local_40;
    fmt._M_len = (size_t)"- mutation variables {}% with  {}% of set\n";
    to_log<double,double>(_stdout,(FILE *)0x7,0x2a,fmt,args,(double *)CONCAT44(i,uStack_58));
    i = 0;
    iVar1 = (x->super_bit_array_impl).m_size;
    local_48 = local_40;
    local_50 = local_38;
    for (; i != iVar1; i = i + 1) {
      dVar2 = std::
              generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                        (&ctx->rng);
      if (dVar2 < local_48) {
        fmt_00._M_str = (char *)&i;
        fmt_00._M_len = (size_t)"- mutate variable {}\n";
        to_log<int>(_stdout,(FILE *)0x9,0x15,fmt_00,(int *)args);
        index = i;
        dVar2 = std::
                generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                          (&ctx->rng);
        bit_array_impl::set(&x->super_bit_array_impl,index,dVar2 < local_50);
      }
    }
  }
  return;
}

Assistant:

void mutation(local_context& ctx, bit_array& x)
    {
        if (ctx.value_p_dist.mean() == 0.0 && ctx.value_p_dist.stddev() == 0.0)
            return;

        double val_p, var_p;

        do
            var_p = ctx.variable_p_dist(ctx.rng);
        while (var_p <= 0.0 || var_p >= 1.0);

        do
            val_p = ctx.value_p_dist(ctx.rng);
        while (val_p < 0.0 || val_p > 1.0);

        to_log(stdout,
               7u,
               "- mutation variables {}% with "
               " {}% of set\n",
               var_p,
               val_p);

        std::bernoulli_distribution dist_var_p(var_p);
        std::bernoulli_distribution dist_value_p(val_p);

        for (int i = 0, e = x.size(); i != e; ++i) {
            if (dist_var_p(ctx.rng)) {
                to_log(stdout, 9u, "- mutate variable {}\n", i);

                x.set(i, dist_value_p(ctx.rng));
            }
        }
    }